

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O3

void __thiscall
absl::lts_20240722::log_internal::LogToSinks
          (log_internal *this,LogEntry *entry,Span<absl::lts_20240722::LogSink_*> extra_sinks,
          bool extra_sinks_only)

{
  undefined8 uVar1;
  char *pcVar2;
  long lVar3;
  iterator __begin3;
  undefined8 *puVar4;
  
  anon_unknown_0::GlobalSinks();
  if (extra_sinks.ptr_ != (pointer)0x0) {
    lVar3 = 0;
    do {
      (**(code **)(**(long **)(entry + lVar3) + 0x10))(*(long **)(entry + lVar3),this);
      lVar3 = lVar3 + 8;
    } while ((long)extra_sinks.ptr_ << 3 != lVar3);
  }
  if ((char)extra_sinks.len_ == '\0') {
    pcVar2 = (char *)__tls_get_addr(&PTR_00104fc8);
    if (*pcVar2 == '\x01') {
      absl::lts_20240722::log_internal::WriteToStderr
                (*(long *)(this + 0x48) + -1,*(undefined8 *)(this + 0x40),
                 *(undefined4 *)(this + 0x28));
      return;
    }
    absl::lts_20240722::Mutex::ReaderLock();
    *pcVar2 = '\x01';
    uVar1 = anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_;
    for (puVar4 = (undefined8 *)anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_;
        (undefined8 *)uVar1 != puVar4; puVar4 = puVar4 + 1) {
      (**(code **)(*(long *)*puVar4 + 0x10))((long *)*puVar4,this);
    }
    *pcVar2 = '\0';
    absl::lts_20240722::Mutex::ReaderUnlock();
  }
  return;
}

Assistant:

void LogToSinks(const absl::LogEntry& entry,
                absl::Span<absl::LogSink*> extra_sinks, bool extra_sinks_only) {
  log_internal::GlobalSinks().LogToSinks(entry, extra_sinks, extra_sinks_only);
}